

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_addmul_v_uint64_192(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  block_t *fblock;
  long lVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  iVar2 = 3;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    uVar3 = v->w64[0];
    for (lVar1 = 0; fblock = (block_t *)((long)A->w64 + lVar1), (int)lVar1 != 0x800;
        lVar1 = lVar1 + 0x20) {
      mzd_xor_mask_uint64_block(c,fblock,-(ulong)((uint)uVar3 & 1),3);
      uVar3 = uVar3 >> 1;
    }
    v = (mzd_local_t *)((long)v + 8);
    A = fblock;
  }
  return;
}

Assistant:

void mzd_addmul_v_uint64_192(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  for (unsigned int w = 3; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; --i, idx >>= 1, ++Ablock) {
      const word mask = -(idx & 1);
      mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
    }
  }
}